

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDNoKeepAlive(ImGuiWindow *this,void *ptr)

{
  ImGuiID id_00;
  uint *puVar1;
  ImGuiContext_conflict *g;
  ImGuiID id;
  ImGuiID seed;
  void *ptr_local;
  ImGuiWindow *this_local;
  
  _id = ptr;
  ptr_local = this;
  puVar1 = ImVector<unsigned_int>::back(&this->IDStack);
  id_00 = ImHashData(&id,8,*puVar1);
  if (GImGui->DebugHookIdInfo == id_00) {
    ImGui::DebugHookIdInfo(id_00,0xc,_id,(void *)0x0);
  }
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetIDNoKeepAlive(const void* ptr)
{
    ImGuiID seed = IDStack.back();
    ImGuiID id = ImHashData(&ptr, sizeof(void*), seed);
    ImGuiContext& g = *GImGui;
    if (g.DebugHookIdInfo == id)
        ImGui::DebugHookIdInfo(id, ImGuiDataType_Pointer, ptr, NULL);
    return id;
}